

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

GreaterThanLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::GreaterThanLayerParams>
          (Arena *arena)

{
  GreaterThanLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (GreaterThanLayerParams *)operator_new(0x18);
    CoreML::Specification::GreaterThanLayerParams::GreaterThanLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (GreaterThanLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x18,
                      (type_info *)&CoreML::Specification::GreaterThanLayerParams::typeinfo);
    CoreML::Specification::GreaterThanLayerParams::GreaterThanLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }